

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O0

void duckdb::TupleDataValueStore<duckdb::string_t>
               (string_t *source,data_ptr_t *row_location,idx_t offset_in_row,
               data_ptr_t *heap_location)

{
  bool bVar1;
  char *size;
  idx_t iVar2;
  string_t *in_RCX;
  long in_RDX;
  long *in_RSI;
  string_t *in_RDI;
  string_t *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  
  bVar1 = string_t::IsInlined((string_t *)0x165cf22);
  if (bVar1) {
    Store<duckdb::string_t>(in_RDI,(data_ptr_t)(*in_RSI + in_RDX));
  }
  else {
    size = string_t::GetData(in_stack_ffffffffffffffc0);
    string_t::GetSize(in_RDI);
    FastMemcpy((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,(size_t)size);
    const_char_ptr_cast<unsigned_char>(*(uchar **)&in_RCX->value);
    iVar2 = string_t::GetSize(in_RDI);
    UnsafeNumericCast<unsigned_int,unsigned_long,void>(iVar2);
    string_t::string_t(in_RCX,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    Store<duckdb::string_t>((string_t *)&stack0xffffffffffffffd0,(data_ptr_t)(*in_RSI + in_RDX));
    iVar2 = string_t::GetSize(in_RDI);
    *(idx_t *)&in_RCX->value = iVar2 + *(long *)&in_RCX->value;
  }
  return;
}

Assistant:

inline void TupleDataValueStore(const string_t &source, const data_ptr_t &row_location, const idx_t offset_in_row,
                                data_ptr_t &heap_location) {
#ifdef DEBUG
	source.VerifyCharacters();
#endif
	if (source.IsInlined()) {
		Store<string_t>(source, row_location + offset_in_row);
	} else {
		FastMemcpy(heap_location, source.GetData(), source.GetSize());
		Store<string_t>(string_t(const_char_ptr_cast(heap_location), UnsafeNumericCast<uint32_t>(source.GetSize())),
		                row_location + offset_in_row);
		heap_location += source.GetSize();
	}
}